

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O2

ON_NameHash * __thiscall ON_ModelComponent::Internal_NameHash(ON_ModelComponent *this)

{
  ON_NameHash *this_00;
  bool bVar1;
  ON_UUID *pOVar2;
  ON_UUID name_parent_id;
  ON_UUID local_58;
  ON_NameHash local_40;
  
  this_00 = &this->m_component_name_hash;
  bVar1 = ON_NameHash::IsEmptyNameHash(this_00);
  if (bVar1) {
    bVar1 = ON_wString::IsNotEmpty(&this->m_component_name);
    if (bVar1) {
      bVar1 = UniqueNameIncludesParent(this->m_component_type);
      if (bVar1) {
        pOVar2 = &this->m_component_parent_id;
      }
      else {
        pOVar2 = &ON_nil_uuid;
      }
      local_58.Data1 = pOVar2->Data1;
      local_58.Data2 = pOVar2->Data2;
      local_58.Data3 = pOVar2->Data3;
      local_58.Data4 = *&pOVar2->Data4;
      ON_NameHash::Create(&local_40,&local_58,&this->m_component_name,
                          this->m_component_type != Group);
      *&(this->m_component_name_hash).m_parent_id.Data4 = local_40.m_parent_id.Data4;
      *(undefined8 *)((this->m_component_name_hash).m_sha1_hash.m_digest + 0xc) =
           local_40.m_sha1_hash.m_digest._12_8_;
      (this->m_component_name_hash).m_parent_id.Data1 = local_40.m_parent_id.Data1;
      (this->m_component_name_hash).m_parent_id.Data2 = local_40.m_parent_id.Data2;
      (this->m_component_name_hash).m_parent_id.Data3 = local_40.m_parent_id.Data3;
      this_00->m_flags = local_40.m_flags;
      (this_00->m_sha1_hash).m_digest[0] = local_40.m_sha1_hash.m_digest[0];
      (this_00->m_sha1_hash).m_digest[1] = local_40.m_sha1_hash.m_digest[1];
      (this_00->m_sha1_hash).m_digest[2] = local_40.m_sha1_hash.m_digest[2];
      (this_00->m_sha1_hash).m_digest[3] = local_40.m_sha1_hash.m_digest[3];
      *(undefined8 *)((this->m_component_name_hash).m_sha1_hash.m_digest + 4) =
           local_40.m_sha1_hash.m_digest._4_8_;
    }
  }
  return this_00;
}

Assistant:

const ON_NameHash& ON_ModelComponent::Internal_NameHash() const
{
  if (m_component_name_hash.IsEmptyNameHash() && m_component_name.IsNotEmpty())
  {
    // lazy evaluation because SHA-1 calculation takes appreciable time

    // For components whose names are in a tree structure, like layers,
    // the parent id must be included.
    // For all other components, the parent id must be ignored.
    const ON_UUID name_parent_id 
      = ON_ModelComponent::UniqueNameIncludesParent(m_component_type)
      ? m_component_parent_id 
      : ON_nil_uuid;
    const bool bIgnoreCase = ON_ModelComponent::UniqueNameIgnoresCase(m_component_type);
    m_component_name_hash = ON_NameHash::Create(name_parent_id,m_component_name,bIgnoreCase);
  }
  return m_component_name_hash;
}